

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPacking.cpp
# Opt level: O1

bool __thiscall
wasm::MemoryPacking::canOptimize
          (MemoryPacking *this,
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          *memories,
          vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
          *dataSegments)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  DataSegment *pDVar4;
  Expression *pEVar5;
  bool bVar6;
  Address AVar7;
  bool bVar8;
  iterator __begin1;
  pointer puVar9;
  Span span;
  undefined1 local_60 [8];
  DisjointSpans space;
  
  puVar1 = (memories->
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (memories->
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (((ulong)((long)puVar2 - (long)puVar1) < 9 && puVar2 != puVar1) &&
     ((*(char **)((long)&(((puVar1->_M_t).
                           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                           .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->
                         super_Importable).module + 8) == (char *)0x0 ||
      ((((this->super_Pass).runner)->options).zeroFilledMemory == true)))) {
    puVar9 = (dataSegments->
             super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (dataSegments->
             super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    bVar8 = true;
    if (8 < (ulong)((long)puVar3 - (long)puVar9)) {
      for (; puVar9 != puVar3; puVar9 = puVar9 + 1) {
        pDVar4 = (puVar9->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar4->isPassive == false) {
          pEVar5 = pDVar4->offset;
          if (pEVar5->_id != ConstId) goto LAB_0079f2dd;
          Literal::getUnsigned((Literal *)(pEVar5 + 1));
        }
      }
      space.spans._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&space;
      space.spans._M_t._M_impl._0_4_ = 0;
      space.spans._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      space.spans._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      space.spans._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      puVar3 = (dataSegments->
               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      space.spans._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           space.spans._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      for (puVar9 = (dataSegments->
                    super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; bVar8 = puVar9 == puVar3, !bVar8;
          puVar9 = puVar9 + 1) {
        pDVar4 = (puVar9->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar4->isPassive == false) {
          pEVar5 = pDVar4->offset;
          if (pEVar5->_id != ConstId) {
            __assert_fail("int(_id) == int(T::SpecificId)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                          ,0x314,"T *wasm::Expression::cast() [T = wasm::Const]");
          }
          AVar7.addr = Literal::getUnsigned((Literal *)(pEVar5 + 1));
          pDVar4 = (puVar9->_M_t).
                   super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                   .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
          span.right.addr =
               (long)*(pointer *)
                      ((long)&(pDVar4->data).super__Vector_base<char,_std::allocator<char>_> + 8) +
               (AVar7.addr -
               *(long *)&(pDVar4->data).super__Vector_base<char,_std::allocator<char>_>._M_impl);
          span.left.addr = AVar7.addr;
          bVar6 = DisjointSpans::addAndCheckOverlap((DisjointSpans *)local_60,span);
          if (bVar6) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"warning: active memory segments have overlap, which ",
                       0x34);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"prevents some optimizations.\n",0x1d);
            if (bVar6) break;
          }
        }
      }
      std::
      _Rb_tree<wasm::DisjointSpans::Span,_wasm::DisjointSpans::Span,_std::_Identity<wasm::DisjointSpans::Span>,_wasm::DisjointSpans::SortByLeft,_std::allocator<wasm::DisjointSpans::Span>_>
      ::~_Rb_tree((_Rb_tree<wasm::DisjointSpans::Span,_wasm::DisjointSpans::Span,_std::_Identity<wasm::DisjointSpans::Span>,_wasm::DisjointSpans::SortByLeft,_std::allocator<wasm::DisjointSpans::Span>_>
                   *)local_60);
    }
  }
  else {
LAB_0079f2dd:
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool MemoryPacking::canOptimize(
  std::vector<std::unique_ptr<Memory>>& memories,
  std::vector<std::unique_ptr<DataSegment>>& dataSegments) {
  if (memories.empty() || memories.size() > 1) {
    return false;
  }
  auto& memory = memories[0];
  // We must optimize under the assumption that memory has been initialized to
  // zero. That is the case for a memory declared in the module, but for a
  // memory that is imported, we must be told that it is zero-initialized.
  if (memory->imported() && !getPassOptions().zeroFilledMemory) {
    return false;
  }

  // One segment is always ok to optimize, as it does not have the potential
  // problems handled below.
  if (dataSegments.size() <= 1) {
    return true;
  }
  // Check if it is ok for us to optimize.
  Address maxAddress = 0;
  for (auto& segment : dataSegments) {
    if (!segment->isPassive) {
      auto* c = segment->offset->dynCast<Const>();
      // If an active segment has a non-constant offset, then what gets written
      // cannot be known until runtime. That is, the active segments are written
      // out at startup, in order, and one may trample the data of another, like
      //
      //  (data (i32.const 100) "a")
      //  (data (i32.const 100) "\00")
      //
      // It is *not* ok to optimize out the zero in the last segment, as it is
      // actually needed, it will zero out the "a" that was written earlier. And
      // if a segment has an imported offset,
      //
      //  (data (i32.const 100) "a")
      //  (data (global.get $x) "\00")
      //
      // then we can't tell if that last segment will end up overwriting or not.
      // The only case we can easily handle is if there is just a single
      // segment, which we handled earlier. (Note that that includes the main
      // case of having a non-constant offset, dynamic linking, in which we have
      // a single segment.)
      if (!c) {
        return false;
      }
      // Note the maximum address so far.
      maxAddress = std::max(
        maxAddress, Address(c->value.getUnsigned() + segment->data.size()));
    }
  }
  // All active segments have constant offsets, known at this time, so we may be
  // able to optimize, but must still check for the trampling problem mentioned
  // earlier.
  // TODO: optimize in the trampling case
  DisjointSpans space;
  for (auto& segment : dataSegments) {
    if (!segment->isPassive) {
      auto* c = segment->offset->cast<Const>();
      Address start = c->value.getUnsigned();
      DisjointSpans::Span span{start, start + segment->data.size()};
      if (space.addAndCheckOverlap(span)) {
        std::cerr << "warning: active memory segments have overlap, which "
                  << "prevents some optimizations.\n";
        return false;
      }
    }
  }
  return true;
}